

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int ftps_open_network(char *filename,curlmembuf *buffer)

{
  int iVar1;
  size_t sVar2;
  ulong __n;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  char *__s;
  float fVar9;
  float version;
  curlmembuf *local_5d8;
  char *local_5d0;
  char tmphost [100];
  char agentStr [100];
  char url [1200];
  
  version = 0.0;
  builtin_strncpy(url,"ftp://",7);
  sVar2 = strlen(filename);
  uVar7 = 0;
  __n = sVar2 & 0xffffffff;
  if ((int)sVar2 < 1) {
    __n = uVar7;
  }
  for (; __n != uVar7; uVar7 = uVar7 + 1) {
    if (filename[uVar7] == '/') {
      __n = uVar7 & 0xffffffff;
      break;
    }
  }
  if (99 < (uint)__n) {
    pcVar8 = "Host name is too long in URL (ftps_open_network)";
    goto LAB_00134cc0;
  }
  pcVar8 = tmphost;
  strncpy(pcVar8,filename,__n);
  local_5d0 = filename + __n;
  tmphost[__n] = '\0';
  pcVar3 = strrchr(pcVar8,0x40);
  local_5d8 = buffer;
  if (pcVar3 == (char *)0x0) {
    __s = "anonymous";
LAB_00134c59:
    fVar9 = ffvers(&version);
    pcVar4 = agentStr;
    snprintf(pcVar4,100,"User-Agent: FITSIO/HEASARC/%-8.4f",(double)fVar9);
  }
  else {
    *pcVar3 = '\0';
    __s = tmphost;
    pcVar4 = strchr(__s,0x3a);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      *pcVar4 = '\0';
      pcVar4 = pcVar4 + 1;
    }
    pcVar8 = pcVar3 + 1;
    if (tmphost[0] == '\0') {
      __s = "anonymous";
    }
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) goto LAB_00134c59;
  }
  sVar2 = strlen(url);
  sVar5 = strlen(pcVar8);
  pcVar3 = local_5d0;
  sVar6 = strlen(local_5d0);
  if (sVar6 + sVar5 + sVar2 < 0x4ad) {
    strcat(url,pcVar8);
    strcat(url,pcVar3);
    sVar2 = strlen(url);
    iVar1 = ssl_get_with_curl(url,local_5d8,__s,pcVar4);
    sVar5 = strlen(url);
    if (((int)sVar5 - (int)sVar2 & 0xfffffffeU) != 2) {
      return iVar1;
    }
    sVar5 = strlen(filename);
    if (sVar5 < 0x3fe) {
      strcat(filename,url + (int)sVar2);
      return iVar1;
    }
    pcVar8 = "Filename is too long to append compression ext (ftps_open_network)";
  }
  else {
    pcVar8 = "Full URL name is too long (ftps_open_network)";
  }
LAB_00134cc0:
  ffpmsg(pcVar8);
  return 0x68;
}

Assistant:

int ftps_open_network(char *filename, curlmembuf* buffer)
{
  char agentStr[SHORTLEN];
  char url[MAXLEN];
  char tmphost[SHORTLEN]; /* work array for separating user/pass/host names */
  char *username=0;
  char *password=0;
  char *hostname=0;
  char *dirpath=0;
  char *strptr=0;
  float version=0.0;
  int iDirpath=0, len=0, origLen=0;
  int status=0; 
  
  strcpy(url,"ftp://");

  /* The filename may already contain a username and password, as indicated 
     by a '@' within the host part of the name (which we'll define as the substring
     before the first '/').  If not, we'll set a default username:password  */
  len = strlen(filename);
  for (iDirpath=0; iDirpath<len; ++iDirpath)
  {
     if (filename[iDirpath] == '/')
        break;
  }
  if (iDirpath > SHORTLEN-1)
  {
     ffpmsg("Host name is too long in URL (ftps_open_network)");
     return (FILE_NOT_OPENED);
  }
  strncpy(tmphost, filename, iDirpath);
  dirpath = &filename[iDirpath];
  tmphost[iDirpath]='\0';
  
  /* There could be more than one '@' since they can also exist in the
     username or password.  Find the right-most '@' and assume that it
     delimits the host name. */
  hostname = strrchr(tmphost, '@');
  if (hostname)
  {
     *hostname = '\0';
     ++hostname;
     /* Assume first occurrence of ':' is indicative of password delimiter. */
     password = strchr(tmphost, ':');
     if (password)
     {
        *password = '\0';
        ++password;
     }
     username = tmphost;
  }
  else
     hostname = tmphost;
  
  if (!username || strlen(username)==0)
     username = "anonymous";
  if (!password || strlen(password)==0)
  {
     snprintf(agentStr,SHORTLEN,"User-Agent: FITSIO/HEASARC/%-8.4f",ffvers(&version));
     password = agentStr;
  }
  
  /* url may eventually have .gz or .Z appended to it */
  if (strlen(url) + strlen(hostname) + strlen(dirpath) > MAXLEN-4)
  {
     ffpmsg("Full URL name is too long (ftps_open_network)");
     return (FILE_NOT_OPENED);
  }
  strcat(url, hostname);
  strcat(url, dirpath);
  
/*  printf("url = %s\n",url);
  printf("username = %s\n",username);
  printf("password = %s\n",password);
  printf("hostname = %s\n",hostname);
*/

  origLen = strlen(url);
  status = ssl_get_with_curl(url, buffer, username, password);
  /* If original url has .gz or .Z appended, do the same to the original filename.
     Note that url also differs from original filename at this point, since
     filename may have included username@password (which url would not). */
  len = strlen(url);
  if ((len-origLen) == 2 || (len-origLen) == 3)
  {
     if (strlen(filename) > FLEN_FILENAME - 4)
     {
        ffpmsg("Filename is too long to append compression ext (ftps_open_network)");
        /* buffer memory must be freed by calling routine */
        return (FILE_NOT_OPENED);
     }
     strptr = url + origLen;
     strcat(filename, strptr);
  }
  return status;
  
 }